

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_contains_range(roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  uint8_t typecode;
  int iVar1;
  container_t *c;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint32_t range_end_00;
  ulong uVar8;
  long lVar9;
  uint range_start_00;
  
  uVar8 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar8 = range_end;
  }
  if (uVar8 <= range_start) {
    return true;
  }
  if (uVar8 - range_start == 1) {
    _Var2 = roaring_bitmap_contains(r,(uint)range_start);
    return _Var2;
  }
  lVar9 = uVar8 - 1;
  iVar6 = (int)((ulong)lVar9 >> 0x10);
  iVar7 = (int)(range_start >> 0x10);
  iVar5 = iVar6 - iVar7;
  iVar1 = (r->high_low_container).size;
  if (iVar5 < iVar1) {
    uVar3 = ra_get_index(&r->high_low_container,(uint16_t)(range_start >> 0x10));
    uVar4 = ra_get_index(&r->high_low_container,(uint16_t)((ulong)lVar9 >> 0x10));
    if ((int)uVar3 < 0) {
      return false;
    }
    uVar4 = (int)uVar4 >> 0x1f ^ uVar4;
    if (uVar4 - uVar3 != iVar5) {
      return false;
    }
    range_start_00 = (uint)range_start & 0xffff;
    range_end_00 = ((uint)lVar9 & 0xffff) + 1;
    typecode = (r->high_low_container).typecodes[uVar3 & 0xffff];
    c = (r->high_low_container).containers[uVar3 & 0xffff];
    if (iVar6 == iVar7) {
      _Var2 = container_contains_range(c,range_start_00,range_end_00,typecode);
      return _Var2;
    }
    _Var2 = container_contains_range(c,range_start_00,0x10000,typecode);
    if (_Var2) {
      if (iVar1 <= (int)uVar4) {
        __assert_fail("ie < hlc_sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x450a,
                      "_Bool roaring_bitmap_contains_range(const roaring_bitmap_t *, uint64_t, uint64_t)"
                     );
      }
      _Var2 = container_contains_range
                        ((r->high_low_container).containers[uVar4 & 0xffff],0,range_end_00,
                         (r->high_low_container).typecodes[uVar4 & 0xffff]);
      if (!_Var2) {
        return false;
      }
      do {
        uVar3 = uVar3 + 1;
        if ((int)uVar4 <= (int)uVar3) {
          return (int)uVar4 <= (int)uVar3;
        }
        _Var2 = container_is_full((r->high_low_container).containers[uVar3 & 0xffff],
                                  (r->high_low_container).typecodes[uVar3 & 0xffff]);
      } while (_Var2);
      return (int)uVar4 <= (int)uVar3;
    }
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains_range(const roaring_bitmap_t *r, uint64_t range_start, uint64_t range_end) {
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }
    if (range_start >= range_end) return true;  // empty range are always contained!
    if (range_end - range_start == 1) return roaring_bitmap_contains(r, (uint32_t)range_start);
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)((range_end - 1) >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
      return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    ie = (ie < 0 ? -ie - 1 : ie);
    if ((is < 0) || ((ie - is) != span)) {
       return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = ((range_end - 1) & 0xFFFF) + 1;
    uint8_t type;
    container_t *c = ra_get_container_at_index(&r->high_low_container, is,
                                               &type);
    if (hb_rs == hb_re) {
      return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
      return false;
    }
    assert(ie < hlc_sz); // would indicate an algorithmic bug
    c = ra_get_container_at_index(&r->high_low_container, ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, i, &type);
        if (!container_is_full(c, type) ) {
          return false;
        }
    }
    return true;
}